

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet_tests.cpp
# Opt level: O0

size_t wallet::wallet_tests::CalculateNestedKeyhashInputSize(bool use_max_sig)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  bool bVar1;
  FillableSigningProvider *this;
  CScript *redeemScript;
  FillableSigningProvider *this_00;
  __extent_storage<18446744073709551615UL> key_00;
  CScript *pCVar2;
  size_t sVar3;
  long in_FS_OFFSET;
  CKey key;
  CTxIn tx_in;
  SignatureData sig_data;
  FillableSigningProvider keystore;
  CScript script_pubkey;
  uint160 script_id;
  CScript inner_script;
  uint160 key_hash;
  CPubKey pubkey;
  SignatureData *in_stack_fffffffffffff958;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff960;
  undefined7 in_stack_fffffffffffff968;
  undefined1 in_stack_fffffffffffff96f;
  CScript *in_stack_fffffffffffff978;
  CKey *in_stack_fffffffffffff980;
  CPubKey *in_stack_fffffffffffff988;
  opcodetype opcode;
  allocator_type *in_stack_fffffffffffff990;
  allocator_type *__a;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff998;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffff9a0;
  uchar *in_stack_fffffffffffff9a8;
  uchar *__first;
  SignatureData *this_01;
  allocator_type local_5f9 [105];
  SignatureData *in_stack_fffffffffffffa70;
  CScript *in_stack_fffffffffffffa78;
  BaseSignatureCreator *in_stack_fffffffffffffa80;
  SigningProvider *in_stack_fffffffffffffa88;
  uchar local_108 [96];
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = (SignatureData *)(local_5f9 + 0x59);
  GenerateRandomKey(SUB81((ulong)in_stack_fffffffffffff960 >> 0x38,0));
  CKey::GetPubKey(in_stack_fffffffffffff980);
  Hash160<CPubKey>(in_stack_fffffffffffff988);
  local_98 = 0;
  uStack_90 = 0;
  local_a8 = 0;
  uStack_a0 = 0;
  CScript::CScript((CScript *)in_stack_fffffffffffff958);
  CScript::operator<<((CScript *)in_stack_fffffffffffff990,
                      (opcodetype)((ulong)in_stack_fffffffffffff988 >> 0x20));
  base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffff958);
  base_blob<160U>::end((base_blob<160U> *)in_stack_fffffffffffff958);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff958);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            (in_stack_fffffffffffff9a0,in_stack_fffffffffffff9a8,
             (uchar *)in_stack_fffffffffffff998._M_extent_value,in_stack_fffffffffffff990);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),in_stack_fffffffffffff960
            );
  b._M_extent._M_extent_value = in_stack_fffffffffffff998._M_extent_value;
  b._M_ptr = (pointer)in_stack_fffffffffffff990;
  this = (FillableSigningProvider *)CScript::operator<<(in_stack_fffffffffffff978,b);
  CScript::CScript((CScript *)in_stack_fffffffffffff958,(CScript *)0xe36ec0);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff958);
  CScript::~CScript((CScript *)in_stack_fffffffffffff958);
  Hash160<CScript>((CScript *)in_stack_fffffffffffff988);
  opcode = (opcodetype)((ulong)in_stack_fffffffffffff988 >> 0x20);
  local_108[0x10] = '\0';
  local_108[0x11] = '\0';
  local_108[0x12] = '\0';
  local_108[0x13] = '\0';
  local_108[0x14] = '\0';
  local_108[0x15] = '\0';
  local_108[0x16] = '\0';
  local_108[0x17] = '\0';
  local_108[0x18] = '\0';
  local_108[0x19] = '\0';
  local_108[0x1a] = '\0';
  local_108[0x1b] = '\0';
  local_108[0x1c] = '\0';
  local_108[0x1d] = '\0';
  local_108[0x1e] = '\0';
  local_108[0x1f] = '\0';
  local_108[0] = '\0';
  local_108[1] = '\0';
  local_108[2] = '\0';
  local_108[3] = '\0';
  local_108[4] = '\0';
  local_108[5] = '\0';
  local_108[6] = '\0';
  local_108[7] = '\0';
  local_108[8] = '\0';
  local_108[9] = '\0';
  local_108[10] = '\0';
  local_108[0xb] = '\0';
  local_108[0xc] = '\0';
  local_108[0xd] = '\0';
  local_108[0xe] = '\0';
  local_108[0xf] = '\0';
  __first = local_108;
  CScript::CScript((CScript *)in_stack_fffffffffffff958);
  redeemScript = CScript::operator<<((CScript *)in_stack_fffffffffffff990,opcode);
  this_00 = (FillableSigningProvider *)
            base_blob<160U>::begin((base_blob<160U> *)in_stack_fffffffffffff958);
  key_00._M_extent_value =
       (size_t)base_blob<160U>::end((base_blob<160U> *)in_stack_fffffffffffff958);
  __a = local_5f9;
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)in_stack_fffffffffffff958);
  std::vector<unsigned_char,std::allocator<unsigned_char>>::vector<unsigned_char*,void>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,__first,
             (uchar *)key_00._M_extent_value,__a);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)
             CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968),in_stack_fffffffffffff960
            );
  b_00._M_extent._M_extent_value = key_00._M_extent_value;
  b_00._M_ptr = (pointer)__a;
  pCVar2 = CScript::operator<<(in_stack_fffffffffffff978,b_00);
  CScript::operator<<((CScript *)__a,(opcodetype)((ulong)pCVar2 >> 0x20));
  CScript::CScript((CScript *)in_stack_fffffffffffff958,(CScript *)0xe36ff1);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_fffffffffffff96f,in_stack_fffffffffffff968));
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)in_stack_fffffffffffff958);
  CScript::~CScript((CScript *)in_stack_fffffffffffff958);
  FillableSigningProvider::FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffff958);
  FillableSigningProvider::AddCScript(this,redeemScript);
  FillableSigningProvider::AddKeyPubKey(this_00,(CKey *)key_00._M_extent_value,(CPubKey *)__a);
  SignatureData::SignatureData(this_01);
  bVar1 = ProduceSignature(in_stack_fffffffffffffa88,in_stack_fffffffffffffa80,
                           in_stack_fffffffffffffa78,in_stack_fffffffffffffa70);
  if (!bVar1) {
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/wallet_tests.cpp"
                  ,0x2ff,"size_t wallet::wallet_tests::CalculateNestedKeyhashInputSize(bool)");
  }
  CTxIn::CTxIn((CTxIn *)in_stack_fffffffffffff958);
  UpdateInput((CTxIn *)in_stack_fffffffffffff958,(SignatureData *)0xe37275);
  sVar3 = GetVirtualTransactionInputSize((CTxIn *)in_stack_fffffffffffff958);
  CTxIn::~CTxIn((CTxIn *)in_stack_fffffffffffff958);
  SignatureData::~SignatureData(in_stack_fffffffffffff958);
  FillableSigningProvider::~FillableSigningProvider
            ((FillableSigningProvider *)in_stack_fffffffffffff958);
  CScript::~CScript((CScript *)in_stack_fffffffffffff958);
  CScript::~CScript((CScript *)in_stack_fffffffffffff958);
  CKey::~CKey((CKey *)in_stack_fffffffffffff958);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return sVar3;
  }
  __stack_chk_fail();
}

Assistant:

static size_t CalculateNestedKeyhashInputSize(bool use_max_sig)
{
    // Generate ephemeral valid pubkey
    CKey key = GenerateRandomKey();
    CPubKey pubkey = key.GetPubKey();

    // Generate pubkey hash
    uint160 key_hash(Hash160(pubkey));

    // Create inner-script to enter into keystore. Key hash can't be 0...
    CScript inner_script = CScript() << OP_0 << std::vector<unsigned char>(key_hash.begin(), key_hash.end());

    // Create outer P2SH script for the output
    uint160 script_id(Hash160(inner_script));
    CScript script_pubkey = CScript() << OP_HASH160 << std::vector<unsigned char>(script_id.begin(), script_id.end()) << OP_EQUAL;

    // Add inner-script to key store and key to watchonly
    FillableSigningProvider keystore;
    keystore.AddCScript(inner_script);
    keystore.AddKeyPubKey(key, pubkey);

    // Fill in dummy signatures for fee calculation.
    SignatureData sig_data;

    if (!ProduceSignature(keystore, use_max_sig ? DUMMY_MAXIMUM_SIGNATURE_CREATOR : DUMMY_SIGNATURE_CREATOR, script_pubkey, sig_data)) {
        // We're hand-feeding it correct arguments; shouldn't happen
        assert(false);
    }

    CTxIn tx_in;
    UpdateInput(tx_in, sig_data);
    return (size_t)GetVirtualTransactionInputSize(tx_in);
}